

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall QPainter::drawLines(QPainter *this,QLineF *lines,int lineCount)

{
  double *pdVar1;
  qreal *pqVar2;
  double *pdVar3;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  QPainterState *pQVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  TransformationType TVar9;
  QPaintEngine *pQVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QPainterPath linePath;
  QPainterPath local_60;
  QPointF local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((lineCount < 1) ||
     (this_00._M_head_impl =
           (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
           super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl,
     ((this_00._M_head_impl)->engine)._M_t.
     super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
     super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
     super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0)) {
LAB_003da0f5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pQVar10 = &(this_00._M_head_impl)->extended->super_QPaintEngine;
    if (pQVar10 == (QPaintEngine *)0x0) {
      QPainterPrivate::updateState
                (this_00._M_head_impl,
                 ((this_00._M_head_impl)->state)._M_t.
                 super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                 super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl);
      pQVar4 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
      uVar8 = pQVar4->emulationSpecifier & 0x50011c81;
      if (uVar8 != 0) {
        if ((uVar8 == 1) && (TVar9 = QTransform::type(&pQVar4->matrix), TVar9 == TxTranslate)) {
          lVar11 = 0;
          do {
            pdVar1 = (double *)((long)&(lines->pt1).xp + lVar11);
            pdVar3 = (double *)((long)&(lines->pt2).xp + lVar11);
            pQVar4 = ((this_00._M_head_impl)->state)._M_t.
                     super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                     super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                     super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
            dVar7 = (pQVar4->matrix).m_matrix[2][0];
            dVar5 = (pQVar4->matrix).m_matrix[2][1];
            dVar6 = pdVar1[1] + dVar5;
            local_58.yp._0_4_ = SUB84(dVar6,0);
            local_58.xp = *pdVar1 + dVar7;
            local_58.yp._4_4_ = (int)((ulong)dVar6 >> 0x20);
            dVar5 = dVar5 + pdVar3[1];
            local_48._8_4_ = SUB84(dVar5,0);
            local_48._0_8_ = dVar7 + *pdVar3;
            local_48._12_4_ = (int)((ulong)dVar5 >> 0x20);
            pQVar10 = ((this_00._M_head_impl)->engine)._M_t.
                      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>.
                      _M_t.
                      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>
                      .super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
            (*pQVar10->_vptr_QPaintEngine[8])(pQVar10,&local_58,1);
            lVar11 = lVar11 + 0x20;
          } while ((ulong)(uint)lineCount << 5 != lVar11);
        }
        else {
          local_60.d_ptr.d.ptr =
               (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
          QPainterPath::QPainterPath(&local_60);
          uVar12 = 1;
          if (1 < lineCount) {
            uVar12 = (ulong)(uint)lineCount;
          }
          lVar11 = 0;
          do {
            pqVar2 = (qreal *)((long)&(lines->pt1).xp + lVar11);
            local_58.xp = *pqVar2;
            local_58.yp = pqVar2[1];
            QPainterPath::moveTo(&local_60,&local_58);
            local_58 = *(QPointF *)((long)&(lines->pt2).xp + lVar11);
            QPainterPath::lineTo(&local_60,&local_58);
            lVar11 = lVar11 + 0x20;
          } while (uVar12 * 0x20 != lVar11);
          QPainterPrivate::draw_helper(this_00._M_head_impl,&local_60,StrokeDraw);
          QPainterPath::~QPainterPath(&local_60);
        }
        goto LAB_003da0f5;
      }
      pQVar10 = ((this_00._M_head_impl)->engine)._M_t.
                super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
                super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
                super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (*((QPaintEngine *)&pQVar10->_vptr_QPaintEngine)->_vptr_QPaintEngine[8])
                (pQVar10,lines,(ulong)(uint)lineCount);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::drawLines(const QLineF *lines, int lineCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawLines(), line count=%d\n", lineCount);
#endif

    Q_D(QPainter);

    if (!d->engine || lineCount < 1)
        return;

    if (d->extended) {
        d->extended->drawLines(lines, lineCount);
        return;
    }

    d->updateState(d->state);

    uint lineEmulation = line_emulation(d->state->emulationSpecifier);

    if (lineEmulation) {
        if (lineEmulation == QPaintEngine::PrimitiveTransform
            && d->state->matrix.type() == QTransform::TxTranslate) {
            for (int i = 0; i < lineCount; ++i) {
                QLineF line = lines[i];
                line.translate(d->state->matrix.dx(), d->state->matrix.dy());
                d->engine->drawLines(&line, 1);
            }
        } else {
            QPainterPath linePath;
            for (int i = 0; i < lineCount; ++i) {
                linePath.moveTo(lines[i].p1());
                linePath.lineTo(lines[i].p2());
            }
            d->draw_helper(linePath, QPainterPrivate::StrokeDraw);
        }
        return;
    }
    d->engine->drawLines(lines, lineCount);
}